

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type.h
# Opt level: O3

void density::f_destroy::invoke<density_tests::NonPolymorphicBase>(void *i_object)

{
  if (*i_object != 0x23) {
    density_tests::detail::assert_failed<>
              ("m_int == 35",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
               ,0x18);
  }
  density_tests::InstanceCounted::~InstanceCounted((InstanceCounted *)((long)i_object + 4));
  return;
}

Assistant:

static void invoke(void * i_object) noexcept
        {
            DENSITY_ASSUME(i_object != nullptr);
            TARGET_TYPE * obj = static_cast<TARGET_TYPE *>(i_object);
            static_assert(
              noexcept(obj->TARGET_TYPE::~TARGET_TYPE()),
              "TARGET_TYPE must be nothrow destructible");
            obj->TARGET_TYPE::~TARGET_TYPE();
        }